

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

SQInteger string_find(HSQUIRRELVM v)

{
  SQInteger SVar1;
  SQRESULT SVar2;
  char *pcVar3;
  SQInteger start_idx;
  SQChar *substr;
  SQChar *str;
  SQInteger local_28;
  char *local_20;
  SQChar *local_18;
  
  local_28 = 0;
  SVar1 = sq_gettop(v);
  if (((SVar1 < 2) || (SVar2 = sq_getstring(v,1,&local_18), SVar2 < 0)) ||
     (SVar2 = sq_getstring(v,2,&local_20), SVar2 < 0)) {
    SVar2 = sq_throwerror(v,"invalid param");
    return SVar2;
  }
  if (SVar1 != 2) {
    sq_getinteger(v,3,&local_28);
  }
  SVar1 = sq_getsize(v,1);
  if ((-1 < local_28 && local_28 < SVar1) &&
     (pcVar3 = strstr(local_18 + local_28,local_20), pcVar3 != (char *)0x0)) {
    sq_pushinteger(v,(long)pcVar3 - (long)local_18);
    return 1;
  }
  return 0;
}

Assistant:

static SQInteger string_find(HSQUIRRELVM v)
{
    SQInteger top,start_idx=0;
    const SQChar *str,*substr,*ret;
    if(((top=sq_gettop(v))>1) && SQ_SUCCEEDED(sq_getstring(v,1,&str)) && SQ_SUCCEEDED(sq_getstring(v,2,&substr))){
        if(top>2)sq_getinteger(v,3,&start_idx);
        if((sq_getsize(v,1)>start_idx) && (start_idx>=0)){
            ret=scstrstr(&str[start_idx],substr);
            if(ret){
                sq_pushinteger(v,(SQInteger)(ret-str));
                return 1;
            }
        }
        return 0;
    }
    return sq_throwerror(v,_SC("invalid param"));
}